

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand_rolled_sbo_cow.hpp
# Opt level: O2

void __thiscall
printable_sbo_cow::swap(printable_sbo_cow *this,handle_base **rhs_handle,buffer *rhs_buffer)

{
  buffer *b;
  printable_sbo_cow *h;
  buffer *h_00;
  undefined8 uVar1;
  ptrdiff_t pVar2;
  ptrdiff_t pVar3;
  ptrdiff_t this_offset;
  
  h = (printable_sbo_cow *)this->handle_;
  b = &this->buffer_;
  h_00 = (buffer *)*rhs_handle;
  if ((this + 1 <= h || h < b) && (rhs_buffer + 1 <= h_00 || h_00 < rhs_buffer)) {
    this->handle_ = (handle_base *)h_00;
    *rhs_handle = (handle_base *)h;
  }
  else if (this + 1 <= h || h < b) {
    pVar2 = handle_offset((handle_base *)h_00,rhs_buffer);
    *rhs_handle = this->handle_;
    *(undefined8 *)((this->buffer_)._M_elems + 0x10) = *(undefined8 *)(rhs_buffer->_M_elems + 0x10);
    uVar1 = *(undefined8 *)(rhs_buffer->_M_elems + 8);
    *(undefined8 *)b->_M_elems = *(undefined8 *)rhs_buffer->_M_elems;
    *(undefined8 *)((this->buffer_)._M_elems + 8) = uVar1;
    this->handle_ = (handle_base *)(b->_M_elems + pVar2);
  }
  else {
    pVar2 = handle_offset((handle_base *)h,b);
    if (rhs_buffer + 1 <= h_00 || h_00 < rhs_buffer) {
      this->handle_ = *rhs_handle;
      *(undefined8 *)(rhs_buffer->_M_elems + 0x10) =
           *(undefined8 *)((this->buffer_)._M_elems + 0x10);
      uVar1 = *(undefined8 *)((this->buffer_)._M_elems + 8);
      *(undefined8 *)rhs_buffer->_M_elems = *(undefined8 *)b->_M_elems;
      *(undefined8 *)(rhs_buffer->_M_elems + 8) = uVar1;
    }
    else {
      pVar3 = handle_offset(*rhs_handle,rhs_buffer);
      std::array<unsigned_char,_24UL>::swap(b,rhs_buffer);
      this->handle_ = (handle_base *)(b->_M_elems + pVar3);
    }
    *rhs_handle = (handle_base *)(rhs_buffer->_M_elems + pVar2);
  }
  return;
}

Assistant:

void swap (handle_base * & rhs_handle, buffer & rhs_buffer)
    {
        const bool this_heap_allocated = heap_allocated(handle_, buffer_);
        const bool rhs_heap_allocated = heap_allocated(rhs_handle, rhs_buffer);

        if (this_heap_allocated && rhs_heap_allocated) {
            std::swap(handle_, rhs_handle);
        } else if (this_heap_allocated) {
            const std::ptrdiff_t offset = handle_offset(rhs_handle, rhs_buffer);
            rhs_handle = handle_;
            buffer_ = rhs_buffer;
            handle_ = handle_ptr(char_ptr(&buffer_) + offset);
        } else if (rhs_heap_allocated) {
            const std::ptrdiff_t offset = handle_offset(handle_, buffer_);
            handle_ = rhs_handle;
            rhs_buffer = buffer_;
            rhs_handle = handle_ptr(char_ptr(&rhs_buffer) + offset);
        } else {
            const std::ptrdiff_t this_offset =
                handle_offset(handle_, buffer_);
            const std::ptrdiff_t rhs_offset =
                handle_offset(rhs_handle, rhs_buffer);
            std::swap(buffer_, rhs_buffer);
            handle_ = handle_ptr(char_ptr(&buffer_) + rhs_offset);
            rhs_handle = handle_ptr(char_ptr(&rhs_buffer) + this_offset);
        }
    }